

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yy_4_method_stmt(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  PVIPNode *local_40;
  yythunk *thunk_local;
  int yyleng_local;
  char *yytext_local;
  GREG *G_local;
  
  pPVar1 = G->val[-3];
  if (G->val[-2] == (PVIPNode *)0x0) {
    local_40 = PVIP_node_new_children(&G->data,PVIP_NODE_NOP);
  }
  else {
    local_40 = G->val[-2];
  }
  pPVar1 = PVIP_node_new_children3(&G->data,PVIP_NODE_SUBMETHOD,pPVar1,local_40,G->val[-1]);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_4_method_stmt(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define b G->val[-1]
#define p G->val[-2]
#define i G->val[-3]
  yyprintf((stderr, "do yy_4_method_stmt"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {yy = PVIP_node_new_children3(&(G->data), PVIP_NODE_SUBMETHOD, i, MAYBE(p), b); }\n"));
  yy = PVIP_node_new_children3(&(G->data), PVIP_NODE_SUBMETHOD, i, MAYBE(p), b); ;
#undef b
#undef p
#undef i
}